

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

int __thiscall
doctest::detail::MultiLaneAtomic<int>::load(MultiLaneAtomic<int> *this,memory_order order)

{
  memory_order in_ESI;
  int *in_RDI;
  CacheLineAlignedAtomic *c;
  CacheLineAlignedAtomic *__end0;
  CacheLineAlignedAtomic *__begin0;
  CacheLineAlignedAtomic (*__range3) [32];
  int result;
  memory_order __b;
  int *local_38;
  int local_28;
  int local_14;
  
  local_28 = 0;
  for (local_38 = in_RDI; local_38 != in_RDI + 0x200; local_38 = local_38 + 0x10) {
    std::operator&(in_ESI,__memory_order_mask);
    if (in_ESI - consume < 2) {
      local_14 = *local_38;
    }
    else if (in_ESI == seq_cst) {
      local_14 = *local_38;
    }
    else {
      local_14 = *local_38;
    }
    local_28 = local_14 + local_28;
  }
  return local_28;
}

Assistant:

T load(std::memory_order order = std::memory_order_seq_cst) const DOCTEST_NOEXCEPT {
            auto result = T();
            for(auto const& c : m_atomics) {
                result += c.atomic.load(order);
            }
            return result;
        }